

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::DoLoopBodyStart::AutoRestoreLoopNumbers::~AutoRestoreLoopNumbers
          (AutoRestoreLoopNumbers *this)

{
  char cVar1;
  InterpreterStackFrame *pIVar2;
  long lVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  
  pIVar2 = this->interpreterStackFrame;
  *(undefined8 *)(pIVar2 + 0xcc) = 0xffffffff;
  bVar5 = FunctionBody::RecentlyBailedOutOfJittedLoopBody(*(FunctionBody **)(pIVar2 + 0x88));
  if (bVar5) {
    if (this->doProfileLoopCheck != true) {
      return;
    }
    if (((byte)this->interpreterStackFrame[0xd6] & 0x10) == 0) {
      return;
    }
    if (((byte)this->interpreterStackFrame[0xd6] & 8) != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x178b,"(!interpreterStackFrame->switchProfileMode)",
                                  "!interpreterStackFrame->switchProfileMode");
      if (!bVar5) goto LAB_00a55791;
      *puVar6 = 0;
    }
    this->interpreterStackFrame[0xd6] =
         (InterpreterStackFrame)((byte)this->interpreterStackFrame[0xd6] | 8);
    if (*(int *)(this->interpreterStackFrame + 0xd8) != -1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x178d,
                                  "(interpreterStackFrame->switchProfileModeOnLoopEndNumber == 0u - 1)"
                                  ,
                                  "interpreterStackFrame->switchProfileModeOnLoopEndNumber == 0u - 1"
                                 );
      if (!bVar5) {
LAB_00a55791:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar6 = 0;
    }
    *(uint32 *)(this->interpreterStackFrame + 0xd8) = this->loopNumber;
  }
  else {
    if (*(uint32 *)(this->interpreterStackFrame + 0xd8) == this->loopNumber) {
      if (((byte)this->interpreterStackFrame[0xd6] & 8) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0x1796,"(!interpreterStackFrame->switchProfileMode)",
                                    "!interpreterStackFrame->switchProfileMode");
        if (!bVar5) goto LAB_00a55791;
        *puVar6 = 0;
      }
      this->interpreterStackFrame[0xd6] =
           (InterpreterStackFrame)((byte)this->interpreterStackFrame[0xd6] | 8);
      *(undefined4 *)(this->interpreterStackFrame + 0xd8) = 0xffffffff;
    }
    lVar3 = *(long *)(*(long *)(this->interpreterStackFrame + 0x78) + 0x3b8);
    cVar1 = *(char *)(lVar3 + 0x1658);
    if (cVar1 != '\0') {
      *(char *)(lVar3 + 0x1658) = cVar1 + -1;
    }
  }
  return;
}

Assistant:

~AutoRestoreLoopNumbers()
            {
                interpreterStackFrame->currentLoopNum = LoopHeader::NoLoop;
                interpreterStackFrame->currentLoopCounter = 0;
                Js::FunctionBody* fn = interpreterStackFrame->m_functionBody;
                if (fn->RecentlyBailedOutOfJittedLoopBody())
                {
                    if (doProfileLoopCheck && interpreterStackFrame->isAutoProfiling)
                    {
                        // Start profiling the loop after a bailout. Some bailouts require subsequent profile data collection such
                        // that the rejitted loop body would not bail out again for the same reason.
                        Assert(!interpreterStackFrame->switchProfileMode);
                        interpreterStackFrame->switchProfileMode = true;
                        Assert(interpreterStackFrame->switchProfileModeOnLoopEndNumber == 0u - 1);
                        interpreterStackFrame->switchProfileModeOnLoopEndNumber = loopNumber;
                    }
                }
                else
                {
                    if (interpreterStackFrame->switchProfileModeOnLoopEndNumber == loopNumber)
                    {
                        // Stop profiling since the jitted loop body would be exiting the loop
                        Assert(!interpreterStackFrame->switchProfileMode);
                        interpreterStackFrame->switchProfileMode = true;
                        interpreterStackFrame->switchProfileModeOnLoopEndNumber = 0u - 1;
                    }

                    interpreterStackFrame->scriptContext->GetThreadContext()->DecrementLoopDepth();
                }
            }